

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O3

int capacity_expand(xvec_t *xv,size_t size)

{
  ulong uVar1;
  uchar *puVar2;
  ulong uVar3;
  
  uVar1 = xv->capacity * 2;
  uVar3 = size + xv->size;
  if (uVar3 < uVar1) {
    uVar3 = uVar1;
  }
  puVar2 = (uchar *)realloc(xv->data,xv->val_size * uVar3);
  if (puVar2 != (uchar *)0x0) {
    xv->capacity = uVar3;
    xv->data = puVar2;
  }
  return (int)puVar2;
}

Assistant:

static int capacity_expand(xvec_t* xv, size_t size)
{
    size_t new_cap = xv->capacity << 1; /* xs->capacity * 2; */
    void* new_data;

    size += xv->size;

    if (new_cap < size) new_cap = size;

    new_data = realloc(xv->data, xv->val_size * new_cap);

    if (new_data)
    {
        xv->capacity = new_cap;
        xv->data = new_data;
        return 0;
    }

    return -1;
}